

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.c
# Opt level: O0

int nni_copyin_size(size_t *sp,void *v,size_t sz,size_t minv,size_t maxv,nni_type t)

{
  ulong uVar1;
  size_t val;
  nni_type t_local;
  size_t maxv_local;
  size_t minv_local;
  size_t sz_local;
  void *v_local;
  size_t *sp_local;
  
  if (t == NNI_TYPE_SIZE) {
    uVar1 = *v;
    if ((maxv < uVar1) || (uVar1 < minv)) {
      sp_local._4_4_ = 3;
    }
    else {
      *sp = uVar1;
      sp_local._4_4_ = 0;
    }
  }
  else {
    sp_local._4_4_ = 0x1e;
  }
  return sp_local._4_4_;
}

Assistant:

int
nni_copyin_size(
    size_t *sp, const void *v, size_t sz, size_t minv, size_t maxv, nni_type t)
{
	size_t val;
	NNI_ARG_UNUSED(sz);

	if (t != NNI_TYPE_SIZE) {
		return (NNG_EBADTYPE);
	}

	val = *(size_t *) v;
	if ((val > maxv) || (val < minv)) {
		return (NNG_EINVAL);
	}
	*sp = val;
	return (0);
}